

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::maybeFixWritePassword(QPDFJob *this,int R,string *password)

{
  password_mode_e pVar1;
  bool bVar2;
  Pipeline *this_00;
  runtime_error *prVar3;
  bool is_valid_utf8;
  bool is_utf16;
  bool has_8bit_chars;
  string encoded;
  QPDFLogger local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pVar1 = ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          password_mode;
  if (pVar1 - pm_unicode < 2) {
    QUtil::analyze_encoding(password,&has_8bit_chars,&is_valid_utf8,&is_utf16);
    if (has_8bit_chars != true) {
      return;
    }
    if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        password_mode == pm_unicode) {
      if (is_valid_utf8 == false) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"supplied password is not valid UTF-8");
LAB_0016c0e9:
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (4 < R) {
        return;
      }
      encoded._M_dataplus._M_p = (pointer)&encoded.field_2;
      encoded._M_string_length = 0;
      encoded.field_2._M_local_buf[0] = '\0';
      bVar2 = QUtil::utf8_to_pdf_doc(password,&encoded,'?');
      if (!bVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar3,
                   "supplied password cannot be encoded for 40-bit or 128-bit encryption formats");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_assign((string *)password);
    }
    else {
      if (4 < R) {
        if (is_valid_utf8 != false) {
          return;
        }
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar3,
                   "supplied password is not a valid Unicode password, which is required for 256-bit encryption; to really use this password, rerun with the --password-mode=bytes option"
                  );
        goto LAB_0016c0e9;
      }
      if (is_valid_utf8 == false) {
        return;
      }
      encoded._M_dataplus._M_p = (pointer)&encoded.field_2;
      encoded._M_string_length = 0;
      encoded.field_2._M_local_buf[0] = '\0';
      bVar2 = QUtil::utf8_to_pdf_doc(password,&encoded,'?');
      if (bVar2) {
        local_48._M_unused._M_object = (void *)0x0;
        local_48._8_8_ = 0;
        local_30 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2745:37)>
                   ::_M_invoke;
        local_38 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2745:37)>
                   ::_M_manager;
        doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_48);
        std::_Function_base::~_Function_base((_Function_base *)&local_48);
        std::__cxx11::string::_M_assign((string *)password);
      }
      else {
        QPDFLogger::getError
                  (&local_58,
                   SUB81((((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                  );
        this_00 = Pipeline::operator<<
                            ((Pipeline *)
                             local_58.m.
                             super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&((this->m).
                                      super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->message_prefix);
        Pipeline::operator<<
                  (this_00,
                   ": WARNING: supplied password looks like a Unicode password with characters not allowed in passwords for 40-bit and 128-bit encryption; most readers will not be able to open this file with the supplied password. (Use --password-mode=bytes to suppress this warning and use the password anyway.)\n"
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
  }
  else {
    if (pVar1 != pm_hex_bytes) {
      return;
    }
    QUtil::hex_decode(&encoded,password);
    std::__cxx11::string::operator=((string *)password,(string *)&encoded);
  }
  std::__cxx11::string::~string((string *)&encoded);
  return;
}

Assistant:

void
QPDFJob::maybeFixWritePassword(int R, std::string& password)
{
    switch (m->password_mode) {
    case QPDFJob::pm_bytes:
        QTC::TC("qpdf", "QPDFJob password mode bytes");
        break;

    case QPDFJob::pm_hex_bytes:
        QTC::TC("qpdf", "QPDFJob password mode hex-bytes");
        password = QUtil::hex_decode(password);
        break;

    case QPDFJob::pm_unicode:
    case QPDFJob::pm_auto:
        {
            bool has_8bit_chars;
            bool is_valid_utf8;
            bool is_utf16;
            QUtil::analyze_encoding(password, has_8bit_chars, is_valid_utf8, is_utf16);
            if (!has_8bit_chars) {
                return;
            }
            if (m->password_mode == QPDFJob::pm_unicode) {
                if (!is_valid_utf8) {
                    QTC::TC("qpdf", "QPDFJob password not unicode");
                    throw std::runtime_error("supplied password is not valid UTF-8");
                }
                if (R < 5) {
                    std::string encoded;
                    if (!QUtil::utf8_to_pdf_doc(password, encoded)) {
                        QTC::TC("qpdf", "QPDFJob password not encodable");
                        throw std::runtime_error(
                            "supplied password cannot be encoded for 40-bit "
                            "or 128-bit encryption formats");
                    }
                    password = encoded;
                }
            } else {
                if ((R < 5) && is_valid_utf8) {
                    std::string encoded;
                    if (QUtil::utf8_to_pdf_doc(password, encoded)) {
                        QTC::TC("qpdf", "QPDFJob auto-encode password");
                        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                            v << prefix
                              << ": automatically converting Unicode password to single-byte "
                                 "encoding as required for 40-bit or 128-bit encryption\n";
                        });
                        password = encoded;
                    } else {
                        QTC::TC("qpdf", "QPDFJob bytes fallback warning");
                        *m->log->getError()
                            << m->message_prefix
                            << ": WARNING: supplied password looks like a Unicode password with "
                               "characters not allowed in passwords for 40-bit and 128-bit "
                               "encryption; most readers will not be able to open this file with "
                               "the supplied password. (Use --password-mode=bytes to suppress this "
                               "warning and use the password anyway.)\n";
                    }
                } else if ((R >= 5) && (!is_valid_utf8)) {
                    QTC::TC("qpdf", "QPDFJob invalid utf-8 in auto");
                    throw std::runtime_error(
                        "supplied password is not a valid Unicode password, which is required for "
                        "256-bit encryption; to really use this password, rerun with the "
                        "--password-mode=bytes option");
                }
            }
        }
        break;
    }
}